

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O0

void __thiscall
eglw::anon_unknown_0::CoreLoader::CoreLoader(CoreLoader *this,DynamicLibrary *dynLib)

{
  int iVar1;
  FunctionLibrary *pFVar2;
  undefined4 extraout_var;
  eglGetProcAddressFunc p_Var3;
  DynamicLibrary *dynLib_local;
  CoreLoader *this_local;
  
  FunctionLoader::FunctionLoader(&this->super_FunctionLoader);
  (this->super_FunctionLoader)._vptr_FunctionLoader = (_func_int **)&PTR_get_00ca4180;
  pFVar2 = createStaticLibrary();
  this->m_staticLib = pFVar2;
  this->m_dynLib = dynLib;
  this->m_getProcAddress = (eglGetProcAddressFunc)0x0;
  iVar1 = (*this->m_staticLib->_vptr_FunctionLibrary[2])(this->m_staticLib,"eglGetProcAddress");
  this->m_getProcAddress = (eglGetProcAddressFunc)CONCAT44(extraout_var,iVar1);
  if ((this->m_getProcAddress == (eglGetProcAddressFunc)0x0) &&
     (this->m_dynLib != (DynamicLibrary *)0x0)) {
    p_Var3 = (eglGetProcAddressFunc)
             de::DynamicLibrary::getFunction(this->m_dynLib,"eglGetProcAddress");
    this->m_getProcAddress = p_Var3;
  }
  return;
}

Assistant:

CoreLoader (const de::DynamicLibrary* dynLib)
		: m_staticLib		(createStaticLibrary())
		, m_dynLib			(dynLib)
		, m_getProcAddress	(DE_NULL)
	{
		// Try to obtain eglGetProcAddress
		m_getProcAddress = (eglGetProcAddressFunc)m_staticLib->getFunction("eglGetProcAddress");

		if (!m_getProcAddress && m_dynLib)
			m_getProcAddress = (eglGetProcAddressFunc)m_dynLib->getFunction("eglGetProcAddress");
	}